

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::_updateBuffers(Sandbox *this)

{
  pointer *pppFVar1;
  pointer *pppPVar2;
  pointer *ppFVar3;
  function<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int)> *pfVar4;
  function<void_(vera::Fbo_*,_const_vera::Fbo_*,_int)> *pfVar5;
  iterator __position;
  iterator __position_00;
  pointer pPVar6;
  pointer pPVar7;
  pointer pFVar8;
  pointer pFVar9;
  pointer pSVar10;
  iterator __position_01;
  pointer pFVar11;
  pointer pFVar12;
  undefined1 *puVar13;
  string *psVar14;
  undefined8 uVar15;
  bool bVar16;
  int iVar17;
  int _height;
  pointer ppFVar18;
  Fbo *this_00;
  pointer ppPVar19;
  PingPong *this_01;
  ostream *poVar20;
  long *plVar21;
  undefined8 *puVar22;
  pointer ppFVar23;
  _func_int **pp_Var24;
  pointer ppPVar25;
  DefaultShaders extraout_EDX;
  DefaultShaders extraout_EDX_00;
  DefaultShaders extraout_EDX_01;
  DefaultShaders extraout_EDX_02;
  DefaultShaders DVar26;
  DefaultShaders extraout_EDX_03;
  DefaultShaders extraout_EDX_04;
  DefaultShaders extraout_EDX_05;
  DefaultShaders extraout_EDX_06;
  DefaultShaders _type;
  DefaultShaders extraout_EDX_07;
  DefaultShaders extraout_EDX_08;
  DefaultShaders extraout_EDX_09;
  DefaultShaders _type_00;
  DefaultShaders extraout_EDX_10;
  DefaultShaders extraout_EDX_11;
  DefaultShaders extraout_EDX_12;
  DefaultShaders extraout_EDX_13;
  DefaultShaders _type_01;
  DefaultShaders extraout_EDX_14;
  DefaultShaders extraout_EDX_15;
  DefaultShaders extraout_EDX_16;
  DefaultShaders _type_02;
  DefaultShaders extraout_EDX_17;
  DefaultShaders extraout_EDX_18;
  DefaultShaders extraout_EDX_19;
  DefaultShaders extraout_EDX_20;
  ulong in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  long lVar27;
  pointer pSVar28;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  ulong uVar29;
  pointer pPVar30;
  pointer pFVar31;
  Shader *pSVar32;
  pointer pFVar33;
  pointer pSVar34;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  vec3 vVar35;
  undefined8 local_650;
  undefined1 local_648 [32];
  string *local_628;
  pointer local_620 [2];
  undefined1 local_610 [24];
  undefined1 local_5f8 [16];
  ShaderList *local_5e8;
  float fStack_5e0;
  float fStack_5dc;
  undefined1 local_5d8 [16];
  FboList *local_5c8;
  _func_int **local_5c0;
  Pyramid local_5b8;
  
  if (this->m_buffers_total ==
      (int)((ulong)((long)(this->uniforms).buffers.
                          super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).buffers.
                         super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    pSVar28 = (this->m_buffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_buffers_shaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,(DefaultShaders)in_RDX);
        vera::Shader::setSource
                  ((Shader *)((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27),
                   &this->m_frag_source,(string *)&local_5b8);
        in_RDX = extraout_RDX;
        if (local_5b8._vptr_Pyramid !=
            (_func_int **)((long)&local_5b8.pass.super__Function_base._M_functor + 8)) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
          in_RDX = extraout_RDX_00;
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_buffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_buffers_shaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
  }
  else {
    if (this->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Creating/removing ",0x12);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," buffers to match ",0x12);
      plVar21 = (long *)std::ostream::operator<<((ostream *)poVar20,this->m_buffers_total);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
      in_RDX = extraout_RDX_01;
    }
    local_628 = (string *)&this->m_buffers_shaders;
    pSVar28 = (this->m_buffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_buffers_shaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        bVar16 = vera::Shader::isLoaded
                           ((Shader *)
                            ((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27));
        in_RDX = extraout_RDX_02;
        if (bVar16) {
          vera::Shader::detach
                    ((Shader *)
                     ((long)&(((((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                                &local_628->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start)
                             ->super_HaveDefines)._vptr_HaveDefines + lVar27),0x8b31);
          in_RDX = extraout_RDX_03;
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_buffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_buffers_shaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
    ppFVar18 = (this->uniforms).buffers.
               super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppFVar23 = (this->uniforms).buffers.
               super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppFVar23 != ppFVar18) {
      uVar29 = 0;
      do {
        if (ppFVar18[uVar29] != (Fbo *)0x0) {
          (*ppFVar18[uVar29]->_vptr_Fbo[1])();
        }
        uVar29 = uVar29 + 1;
        ppFVar18 = (this->uniforms).buffers.
                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppFVar23 = (this->uniforms).buffers.
                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        in_RDX = (long)ppFVar23 - (long)ppFVar18 >> 3;
      } while (uVar29 < in_RDX);
    }
    if (ppFVar23 != ppFVar18) {
      (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl
      .super__Vector_impl_data._M_finish = ppFVar18;
    }
    pSVar28 = (this->m_buffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar10 = (this->m_buffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar34 = pSVar28;
    if (pSVar10 != pSVar28) {
      do {
        (**(pSVar34->super_HaveDefines)._vptr_HaveDefines)(pSVar34);
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar10);
      (this->m_buffers_shaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar28;
      in_RDX = extraout_RDX_04;
    }
    local_650 = (ulong)local_650._4_4_ << 0x20;
    if (0 < this->m_buffers_total) {
      local_610._16_8_ = &(this->uniforms).buffers;
      local_5f8._0_8_ = &this->m_frag_source;
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      do {
        this_00 = (Fbo *)operator_new(0x38);
        vera::Fbo::Fbo(this_00);
        __position._M_current =
             (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_5b8._vptr_Pyramid = (_func_int **)this_00;
        if (__position._M_current ==
            (this->uniforms).buffers.super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Fbo*,std::allocator<vera::Fbo*>>::_M_realloc_insert<vera::Fbo*>
                    ((vector<vera::Fbo*,std::allocator<vera::Fbo*>> *)local_610._16_8_,__position,
                     (Fbo **)&local_5b8);
        }
        else {
          *__position._M_current = this_00;
          pppFVar1 = &(this->uniforms).buffers.
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
        vera::toString<int>((string *)local_648,(int *)&local_650);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f25a1);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        vVar35 = getBufferSize((string *)local_5f8._0_8_,(string *)&local_5b8);
        local_5d8._8_4_ = extraout_XMM0_Dc;
        local_5d8._0_8_ = vVar35._0_8_;
        local_5d8._12_4_ = extraout_XMM0_Dd;
        local_5e8 = (ShaderList *)CONCAT44(local_5e8._4_4_,vVar35.field_2);
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        }
        uVar15 = local_610._16_8_;
        plVar21 = *(long **)(*(long *)local_610._16_8_ + (long)(int)local_650 * 8);
        (**(code **)(*plVar21 + 0x10))
                  (plVar21,(long)(float)local_5d8._0_4_,(long)(float)local_5d8._4_4_,2,0,0,1);
        *(float *)(*(long *)(*(long *)uVar15 + (long)(int)local_650 * 8) + 8) = local_5e8._0_4_;
        vera::Shader::Shader((Shader *)&local_5b8);
        psVar14 = local_628;
        std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                  ((vector<vera::Shader,_std::allocator<vera::Shader>_> *)local_628,
                   (Shader *)&local_5b8);
        vera::Shader::~Shader((Shader *)&local_5b8);
        pSVar28 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                   &psVar14->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start +
                  (int)local_650;
        vera::toString<int>((string *)local_648,(int *)&local_650);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f0e1e);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        local_620[0] = (pointer)local_610;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"");
        (*(pSVar28->super_HaveDefines)._vptr_HaveDefines[10])
                  (pSVar28,&local_5b8,(string *)local_620);
        DVar26 = extraout_EDX;
        if (local_620[0] != (pointer)local_610) {
          operator_delete(local_620[0],(ulong)(local_610._0_8_ + 1));
          DVar26 = extraout_EDX_00;
        }
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
          DVar26 = extraout_EDX_01;
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
          DVar26 = extraout_EDX_02;
        }
        lVar27 = (long)(int)local_650;
        pSVar28 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                   &local_628->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
        vera::Shader::setSource(pSVar28 + lVar27,(string *)local_5f8._0_8_,(string *)&local_5b8);
        in_RDX = extraout_RDX_05;
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
          in_RDX = extraout_RDX_06;
        }
        iVar17 = (int)local_650 + 1;
        local_650 = CONCAT44(local_650._4_4_,iVar17);
      } while (iVar17 < this->m_buffers_total);
    }
  }
  if (this->m_doubleBuffers_total ==
      (int)((ulong)((long)(this->uniforms).doubleBuffers.
                          super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).doubleBuffers.
                         super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pSVar28 = (this->m_doubleBuffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_doubleBuffers_shaders).
        super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,(DefaultShaders)in_RDX);
        vera::Shader::setSource
                  ((Shader *)((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27),
                   &this->m_frag_source,(string *)&local_5b8);
        in_RDX = extraout_RDX_07;
        if (local_5b8._vptr_Pyramid !=
            (_func_int **)((long)&local_5b8.pass.super__Function_base._M_functor + 8)) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
          in_RDX = extraout_RDX_08;
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_doubleBuffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_doubleBuffers_shaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
  }
  else {
    if (this->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Creating/removing ",0x12);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," double buffers to match ",0x19);
      plVar21 = (long *)std::ostream::operator<<((ostream *)poVar20,this->m_doubleBuffers_total);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
    }
    local_628 = (string *)&this->m_doubleBuffers_shaders;
    pSVar28 = (this->m_doubleBuffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_doubleBuffers_shaders).
        super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        bVar16 = vera::Shader::isLoaded
                           ((Shader *)
                            ((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27));
        if (bVar16) {
          vera::Shader::detach
                    ((Shader *)
                     ((long)&(((((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                                &local_628->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start)
                             ->super_HaveDefines)._vptr_HaveDefines + lVar27),0x8b31);
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_doubleBuffers_shaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_doubleBuffers_shaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
    ppPVar19 = (this->uniforms).doubleBuffers.
               super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppPVar25 = (this->uniforms).doubleBuffers.
               super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (ppPVar25 != ppPVar19) {
      uVar29 = 0;
      do {
        if (ppPVar19[uVar29] != (PingPong *)0x0) {
          (*ppPVar19[uVar29]->_vptr_PingPong[1])();
        }
        uVar29 = uVar29 + 1;
        ppPVar19 = (this->uniforms).doubleBuffers.
                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppPVar25 = (this->uniforms).doubleBuffers.
                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (uVar29 < (ulong)((long)ppPVar25 - (long)ppPVar19 >> 3));
    }
    if (ppPVar25 != ppPVar19) {
      (this->uniforms).doubleBuffers.
      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppPVar19;
    }
    pSVar28 = (this->m_doubleBuffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar10 = (this->m_doubleBuffers_shaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar34 = pSVar28;
    if (pSVar10 != pSVar28) {
      do {
        (**(pSVar34->super_HaveDefines)._vptr_HaveDefines)(pSVar34);
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar10);
      (this->m_doubleBuffers_shaders).
      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
      super__Vector_impl_data._M_finish = pSVar28;
    }
    local_650 = local_650 & 0xffffffff00000000;
    if (0 < this->m_doubleBuffers_total) {
      local_610._16_8_ = &(this->uniforms).doubleBuffers;
      local_5f8._0_8_ = &this->m_frag_source;
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      do {
        this_01 = (PingPong *)operator_new(0x90);
        vera::PingPong::PingPong(this_01);
        __position_00._M_current =
             (this->uniforms).doubleBuffers.
             super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_5b8._vptr_Pyramid = (_func_int **)this_01;
        if (__position_00._M_current ==
            (this->uniforms).doubleBuffers.
            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::PingPong*,std::allocator<vera::PingPong*>>::
          _M_realloc_insert<vera::PingPong*>
                    ((vector<vera::PingPong*,std::allocator<vera::PingPong*>> *)local_610._16_8_,
                     __position_00,(PingPong **)&local_5b8);
        }
        else {
          *__position_00._M_current = this_01;
          pppPVar2 = &(this->uniforms).doubleBuffers.
                      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          *pppPVar2 = *pppPVar2 + 1;
        }
        vera::toString<int>((string *)local_648,(int *)&local_650);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f25bc);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        vVar35 = getBufferSize((string *)local_5f8._0_8_,(string *)&local_5b8);
        local_5d8._8_4_ = extraout_XMM0_Dc_00;
        local_5d8._0_8_ = vVar35._0_8_;
        local_5d8._12_4_ = extraout_XMM0_Dd_00;
        local_5e8 = (ShaderList *)CONCAT44(local_5e8._4_4_,vVar35.field_2);
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        }
        uVar15 = local_610._16_8_;
        plVar21 = *(long **)(*(long *)local_610._16_8_ + (long)(int)local_650 * 8);
        (**(code **)(*plVar21 + 0x10))
                  (plVar21,(int)(float)local_5d8._0_4_,(int)(float)local_5d8._4_4_,2,0,0,1);
        lVar27 = *(long *)(*(long *)uVar15 + (long)(int)local_650 * 8);
        *(float *)(lVar27 + 0x20) = local_5e8._0_4_;
        *(float *)(lVar27 + 0x58) = local_5e8._0_4_;
        vera::Shader::Shader((Shader *)&local_5b8);
        psVar14 = local_628;
        std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                  ((vector<vera::Shader,_std::allocator<vera::Shader>_> *)local_628,
                   (Shader *)&local_5b8);
        vera::Shader::~Shader((Shader *)&local_5b8);
        pSVar28 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                   &psVar14->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start +
                  (int)local_650;
        vera::toString<int>((string *)local_648,(int *)&local_650);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f0e17);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        local_620[0] = (pointer)local_610;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"");
        (*(pSVar28->super_HaveDefines)._vptr_HaveDefines[10])
                  (pSVar28,&local_5b8,(string *)local_620);
        DVar26 = extraout_EDX_03;
        if (local_620[0] != (pointer)local_610) {
          operator_delete(local_620[0],(ulong)(local_610._0_8_ + 1));
          DVar26 = extraout_EDX_04;
        }
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
          DVar26 = extraout_EDX_05;
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
          DVar26 = extraout_EDX_06;
        }
        lVar27 = (long)(int)local_650;
        pSVar28 = (((_Vector_base<vera::Shader,_std::allocator<vera::Shader>_> *)
                   &local_628->_M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
        vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
        vera::Shader::setSource(pSVar28 + lVar27,(string *)local_5f8._0_8_,(string *)&local_5b8);
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        }
        iVar17 = (int)local_650 + 1;
        local_650 = CONCAT44(local_650._4_4_,iVar17);
      } while (iVar17 < this->m_doubleBuffers_total);
    }
  }
  if (this->m_pyramid_total !=
      (int)((ulong)((long)(this->uniforms).pyramids.
                          super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).pyramids.
                         super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 7) * -0x45d1745d) {
    if (this->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Removing ",9);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," pyramids to create  ",0x15);
      plVar21 = (long *)std::ostream::operator<<((ostream *)poVar20,this->m_pyramid_total);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
    }
    pSVar28 = (this->m_pyramid_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_pyramid_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
        ._M_impl.super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        bVar16 = vera::Shader::isLoaded
                           ((Shader *)
                            ((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27));
        if (bVar16) {
          vera::Shader::detach
                    ((Shader *)
                     ((long)&(((this->m_pyramid_subshaders).
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
                               _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                             _vptr_HaveDefines + lVar27),0x8b31);
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_pyramid_subshaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_pyramid_subshaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
    pPVar6 = (this->uniforms).pyramids.
             super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar7 = (this->uniforms).pyramids.
             super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar30 = pPVar6;
    if (pPVar7 != pPVar6) {
      do {
        (**pPVar30->_vptr_Pyramid)(pPVar30);
        pPVar30 = pPVar30 + 1;
      } while (pPVar30 != pPVar7);
      (this->uniforms).pyramids.super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
      _M_impl.super__Vector_impl_data._M_finish = pPVar6;
    }
    pFVar8 = (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pFVar9 = (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pFVar31 = pFVar8;
    if (pFVar9 != pFVar8) {
      do {
        (**pFVar31->_vptr_Fbo)(pFVar31);
        pFVar31 = pFVar31 + 1;
      } while (pFVar31 != pFVar9);
      (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>._M_impl.
      super__Vector_impl_data._M_finish = pFVar8;
    }
    pSVar28 = (this->m_pyramid_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar10 = (this->m_pyramid_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar34 = pSVar28;
    if (pSVar10 != pSVar28) {
      do {
        (**(pSVar34->super_HaveDefines)._vptr_HaveDefines)(pSVar34);
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar10);
      (this->m_pyramid_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar28;
    }
    local_620[0] = (pointer)((ulong)local_620[0] & 0xffffffff00000000);
    if (0 < this->m_pyramid_total) {
      local_610._16_8_ = &(this->uniforms).pyramids;
      local_5c8 = &this->m_pyramid_fbos;
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      local_5d8._0_8_ = &this->m_frag_source;
      local_5c0 = (_func_int **)&PTR__Fbo_003ebfd0;
      do {
        vera::toString<int>((string *)local_648,(int *)local_620);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f25dd);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        vVar35 = getBufferSize((string *)local_5d8._0_8_,(string *)&local_5b8);
        local_5f8._8_4_ = extraout_XMM0_Dc_01;
        local_5f8._0_8_ = vVar35._0_8_;
        local_5f8._12_4_ = extraout_XMM0_Dd_01;
        local_628 = (string *)CONCAT44(local_628._4_4_,vVar35.field_2);
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        }
        vera::Shader::Shader((Shader *)&local_5b8);
        std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                  (&this->m_pyramid_subshaders,(Shader *)&local_5b8);
        vera::Shader::~Shader((Shader *)&local_5b8);
        vera::Pyramid::Pyramid(&local_5b8);
        std::vector<vera::Pyramid,_std::allocator<vera::Pyramid>_>::emplace_back<vera::Pyramid>
                  ((vector<vera::Pyramid,_std::allocator<vera::Pyramid>_> *)local_610._16_8_,
                   &local_5b8);
        vera::Pyramid::~Pyramid(&local_5b8);
        local_5e8 = (ShaderList *)CONCAT44(local_5f8._4_4_,local_5f8._4_4_);
        fStack_5e0 = (float)local_5f8._4_4_;
        fStack_5dc = (float)local_5f8._4_4_;
        vera::Pyramid::allocate
                  ((this->uniforms).pyramids.
                   super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                   super__Vector_impl_data._M_start + (int)local_620[0],(int)(float)local_5f8._0_4_,
                   (int)(float)local_5f8._4_4_);
        lVar27 = (long)(int)local_620[0];
        pPVar6 = (this->uniforms).pyramids.
                 super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pPVar6[lVar27].scale = local_628._0_4_;
        local_648._8_4_ = 0;
        local_648._12_4_ = 0;
        local_5b8._vptr_Pyramid =
             *(_func_int ***)&pPVar6[lVar27].pass.super__Function_base._M_functor;
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ =
             (undefined8)*(long *)((long)&pPVar6[lVar27].pass.super__Function_base._M_functor + 8);
        pfVar4 = &pPVar6[lVar27].pass;
        *(Sandbox **)&(pfVar4->super__Function_base)._M_functor = this;
        *(undefined4 *)((long)&(pfVar4->super__Function_base)._M_functor + 8) = 0;
        *(undefined4 *)((long)&(pfVar4->super__Function_base)._M_functor + 0xc) = 0;
        local_5b8.pass.super__Function_base._M_functor._8_8_ =
             pPVar6[lVar27].pass.super__Function_base._M_manager;
        pPVar6[lVar27].pass.super__Function_base._M_manager =
             std::
             _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1468:41)>
             ::_M_manager;
        local_5b8.pass.super__Function_base._M_manager =
             (_Manager_type)pPVar6[lVar27].pass._M_invoker;
        pPVar6[lVar27].pass._M_invoker =
             std::
             _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1468:41)>
             ::_M_invoke;
        local_648._0_8_ = this;
        if ((_Manager_type)local_5b8.pass.super__Function_base._M_functor._8_8_ !=
            (_Manager_type)0x0) {
          (*(code *)local_5b8.pass.super__Function_base._M_functor._8_8_)(&local_5b8,&local_5b8,3);
        }
        vera::Fbo::Fbo((Fbo *)&local_5b8);
        __position_01._M_current =
             (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position_01._M_current ==
            (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<vera::Fbo,_std::allocator<vera::Fbo>_>::_M_realloc_insert<vera::Fbo>
                    (local_5c8,__position_01,(Fbo *)&local_5b8);
        }
        else {
          (__position_01._M_current)->_vptr_Fbo = local_5c0;
          *(void **)&(__position_01._M_current)->scale =
               local_5b8.pass.super__Function_base._M_functor._M_unused._M_object;
          (__position_01._M_current)->m_id = local_5b8.pass.super__Function_base._M_functor._8_4_;
          (__position_01._M_current)->m_fbo_id =
               local_5b8.pass.super__Function_base._M_functor._12_4_;
          *(_Manager_type *)&(__position_01._M_current)->m_old_fbo_id =
               local_5b8.pass.super__Function_base._M_manager;
          (__position_01._M_current)->m_depth_buffer = local_5b8.pass._M_invoker._0_4_;
          (__position_01._M_current)->m_type = local_5b8.pass._M_invoker._4_4_;
          (__position_01._M_current)->m_type = local_5b8.pass._M_invoker._4_4_;
          (__position_01._M_current)->m_width = (int)local_5b8.scale;
          *(undefined8 *)&(__position_01._M_current)->m_height = local_5b8._44_8_;
          ppFVar3 = &(this->m_pyramid_fbos).
                     super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppFVar3 = *ppFVar3 + 1;
        }
        vera::Fbo::~Fbo((Fbo *)&local_5b8);
        pFVar8 = (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        (*pFVar8[(int)local_620[0]]._vptr_Fbo[2])
                  (pFVar8 + (int)local_620[0],(long)(float)local_5f8._0_4_,(long)local_5e8._0_4_,2,0
                   ,0,1);
        (this->m_pyramid_fbos).super__Vector_base<vera::Fbo,_std::allocator<vera::Fbo>_>._M_impl.
        super__Vector_impl_data._M_start[(int)local_620[0]].scale = local_628._0_4_;
        iVar17 = (int)local_620[0] + 1;
        local_620[0] = (pointer)CONCAT44(local_620[0]._4_4_,iVar17);
      } while (iVar17 < this->m_pyramid_total);
    }
  }
  if (0 < this->m_pyramid_total) {
    bVar16 = checkPyramidAlgorithm(&this->m_frag_source);
    if (bVar16) {
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      local_5b8._vptr_Pyramid = (_func_int **)puVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"PYRAMID_ALGORITHM","");
      local_648._0_8_ = (Sandbox *)(local_648 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"");
      vera::HaveDefines::addDefine
                (&(this->m_pyramid_shader).super_HaveDefines,(string *)&local_5b8,
                 (string *)local_648);
      DVar26 = extraout_EDX_07;
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        DVar26 = extraout_EDX_08;
      }
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        DVar26 = extraout_EDX_09;
      }
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
      vera::Shader::setSource(&this->m_pyramid_shader,&this->m_frag_source,(string *)&local_5b8);
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
LAB_001b82c1:
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
      }
    }
    else {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x16,_type);
      vera::getDefaultSrc_abi_cxx11_((string *)local_648,(vera *)0x5,_type_00);
      vera::Shader::setSource(&this->m_pyramid_shader,(string *)&local_5b8,(string *)local_648);
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
      }
      if (local_5b8._vptr_Pyramid !=
          (_func_int **)((long)&local_5b8.pass.super__Function_base._M_functor + 8))
      goto LAB_001b82c1;
    }
  }
  local_650 = 0;
  pSVar28 = (this->m_pyramid_subshaders).
            super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_pyramid_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar28) {
    puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
    local_628 = &this->m_frag_source;
    do {
      uVar29 = local_650;
      vera::toString<unsigned_long>((string *)local_648,&local_650);
      puVar22 = (undefined8 *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f0e58)
      ;
      pp_Var24 = (_func_int **)(puVar22 + 2);
      if ((_func_int **)*puVar22 == pp_Var24) {
        local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
        local_5b8.pass.super__Function_base._M_manager = (_Manager_type)puVar22[3];
        local_5b8._vptr_Pyramid = (_func_int **)puVar13;
      }
      else {
        local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
        local_5b8._vptr_Pyramid = (_func_int **)*puVar22;
      }
      local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)puVar22[1];
      *puVar22 = pp_Var24;
      puVar22[1] = 0;
      *(undefined1 *)(puVar22 + 2) = 0;
      local_620[0] = (pointer)local_610;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"");
      (*pSVar28[uVar29].super_HaveDefines._vptr_HaveDefines[10])
                (pSVar28 + uVar29,&local_5b8,(string *)local_620);
      DVar26 = extraout_EDX_10;
      if (local_620[0] != (pointer)local_610) {
        operator_delete(local_620[0],(ulong)(local_610._0_8_ + 1));
        DVar26 = extraout_EDX_11;
      }
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        DVar26 = extraout_EDX_12;
      }
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        DVar26 = extraout_EDX_13;
      }
      pSVar32 = (this->m_pyramid_subshaders).
                super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                super__Vector_impl_data._M_start + local_650;
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
      vera::Shader::setSource(pSVar32,local_628,(string *)&local_5b8);
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
      }
      local_650 = local_650 + 1;
      pSVar28 = (this->m_pyramid_subshaders).
                super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_650 <
             (ulong)((long)(this->m_pyramid_subshaders).
                           super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pSVar28 >> 8));
  }
  if (this->m_flood_total !=
      (int)((ulong)((long)(this->uniforms).floods.
                          super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->uniforms).floods.
                         super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 6) * -0x55555555) {
    if (this->verbose == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Removing ",9);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," flood to create ",0x11);
      plVar21 = (long *)std::ostream::operator<<((ostream *)poVar20,this->m_flood_total);
      std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
      std::ostream::put((char)plVar21);
      std::ostream::flush();
    }
    local_5e8 = &this->m_flood_subshaders;
    pSVar28 = (this->m_flood_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->m_flood_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish != pSVar28) {
      lVar27 = 0;
      uVar29 = 0;
      do {
        bVar16 = vera::Shader::isLoaded
                           ((Shader *)
                            ((long)&(pSVar28->super_HaveDefines)._vptr_HaveDefines + lVar27));
        if (bVar16) {
          vera::Shader::detach
                    ((Shader *)
                     ((long)&(((local_5e8->
                               super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>).
                               _M_impl.super__Vector_impl_data._M_start)->super_HaveDefines).
                             _vptr_HaveDefines + lVar27),0x8b31);
        }
        uVar29 = uVar29 + 1;
        pSVar28 = (this->m_flood_subshaders).
                  super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar27 = lVar27 + 0x100;
      } while (uVar29 < (ulong)((long)(this->m_flood_subshaders).
                                      super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar28 >>
                               8));
    }
    pFVar11 = (this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pFVar12 = (this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pFVar33 = pFVar11;
    if (pFVar12 != pFVar11) {
      do {
        (**(pFVar33->super_PingPong)._vptr_PingPong)(pFVar33);
        pFVar33 = pFVar33 + 1;
      } while (pFVar33 != pFVar12);
      (this->uniforms).floods.super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
      super__Vector_impl_data._M_finish = pFVar11;
    }
    pSVar28 = (this->m_flood_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar10 = (this->m_flood_subshaders).
              super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar34 = pSVar28;
    if (pSVar10 != pSVar28) {
      do {
        (**(pSVar34->super_HaveDefines)._vptr_HaveDefines)(pSVar34);
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar10);
      (this->m_flood_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish = pSVar28;
    }
    local_620[0] = (pointer)((ulong)local_620[0] & 0xffffffff00000000);
    if (0 < this->m_flood_total) {
      local_610._16_8_ = &(this->uniforms).floods;
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      local_5d8._0_8_ = &this->m_frag_source;
      do {
        vera::toString<int>((string *)local_648,(int *)local_620);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f0e73);
        pp_Var24 = (_func_int **)(plVar21 + 2);
        if ((_func_int **)*plVar21 == pp_Var24) {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8.pass.super__Function_base._M_manager = (_Manager_type)plVar21[3];
          local_5b8._vptr_Pyramid = (_func_int **)puVar13;
        }
        else {
          local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
          local_5b8._vptr_Pyramid = (_func_int **)*plVar21;
        }
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)plVar21[1];
        *plVar21 = (long)pp_Var24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        vVar35 = getBufferSize((string *)local_5d8._0_8_,(string *)&local_5b8);
        local_5f8._8_4_ = extraout_XMM0_Dc_02;
        local_5f8._0_8_ = vVar35._0_8_;
        local_5f8._12_4_ = extraout_XMM0_Dd_02;
        local_628 = (string *)CONCAT44(local_628._4_4_,vVar35.field_2);
        if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
          operator_delete(local_5b8._vptr_Pyramid,
                          (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        }
        if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
          operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        }
        vera::Shader::Shader((Shader *)&local_5b8);
        std::vector<vera::Shader,_std::allocator<vera::Shader>_>::emplace_back<vera::Shader>
                  (local_5e8,(Shader *)&local_5b8);
        vera::Shader::~Shader((Shader *)&local_5b8);
        vera::Flood::Flood((Flood *)&local_5b8);
        std::vector<vera::Flood,_std::allocator<vera::Flood>_>::emplace_back<vera::Flood>
                  ((vector<vera::Flood,_std::allocator<vera::Flood>_> *)local_610._16_8_,
                   (Flood *)&local_5b8);
        vera::Flood::~Flood((Flood *)&local_5b8);
        pFVar11 = (this->uniforms).floods.
                  super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                  super__Vector_impl_data._M_start;
        (*pFVar11[(int)local_620[0]].super_PingPong._vptr_PingPong[2])
                  (pFVar11 + (int)local_620[0],(ulong)(uint)(int)(float)local_5f8._0_4_,
                   (ulong)(uint)(int)(float)local_5f8._4_4_,2,0,0,1);
        lVar27 = (long)(int)local_620[0];
        pFVar11 = (this->uniforms).floods.
                  super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pFVar11[lVar27].scale = local_628._0_4_;
        local_648._8_4_ = 0;
        local_648._12_4_ = 0;
        local_5b8._vptr_Pyramid =
             *(_func_int ***)&pFVar11[lVar27].pass.super__Function_base._M_functor;
        local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ =
             (undefined8)*(long *)((long)&pFVar11[lVar27].pass.super__Function_base._M_functor + 8);
        pfVar5 = &pFVar11[lVar27].pass;
        *(Sandbox **)&(pfVar5->super__Function_base)._M_functor = this;
        *(undefined4 *)((long)&(pfVar5->super__Function_base)._M_functor + 8) = 0;
        *(undefined4 *)((long)&(pfVar5->super__Function_base)._M_functor + 0xc) = 0;
        local_5b8.pass.super__Function_base._M_functor._8_8_ =
             pFVar11[lVar27].pass.super__Function_base._M_manager;
        pFVar11[lVar27].pass.super__Function_base._M_manager =
             std::
             _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1539:39)>
             ::_M_manager;
        local_5b8.pass.super__Function_base._M_manager =
             (_Manager_type)pFVar11[lVar27].pass._M_invoker;
        pFVar11[lVar27].pass._M_invoker =
             std::
             _Function_handler<void_(vera::Fbo_*,_const_vera::Fbo_*,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/src/core/sandbox.cpp:1539:39)>
             ::_M_invoke;
        local_648._0_8_ = this;
        if ((_Manager_type)local_5b8.pass.super__Function_base._M_functor._8_8_ !=
            (_Manager_type)0x0) {
          (*(code *)local_5b8.pass.super__Function_base._M_functor._8_8_)(&local_5b8,&local_5b8,3);
        }
        iVar17 = (int)local_620[0] + 1;
        local_620[0] = (pointer)CONCAT44(local_620[0]._4_4_,iVar17);
      } while (iVar17 < this->m_flood_total);
    }
  }
  if (0 < this->m_flood_total) {
    bVar16 = checkFloodAlgorithm(&this->m_frag_source);
    if (bVar16) {
      puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
      local_5b8._vptr_Pyramid = (_func_int **)puVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"FLOOD_ALGORITHM","");
      local_648._0_8_ = (Sandbox *)(local_648 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_648,"");
      vera::HaveDefines::addDefine
                (&(this->m_flood_shader).super_HaveDefines,(string *)&local_5b8,(string *)local_648)
      ;
      DVar26 = extraout_EDX_14;
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        DVar26 = extraout_EDX_15;
      }
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        DVar26 = extraout_EDX_16;
      }
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
      vera::Shader::setSource(&this->m_flood_shader,&this->m_frag_source,(string *)&local_5b8);
      if (local_5b8._vptr_Pyramid == (_func_int **)puVar13) goto LAB_001b89e2;
    }
    else {
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x17,_type_01);
      vera::getDefaultSrc_abi_cxx11_((string *)local_648,(vera *)0x5,_type_02);
      vera::Shader::setSource(&this->m_flood_shader,(string *)&local_5b8,(string *)local_648);
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
      }
      if (local_5b8._vptr_Pyramid ==
          (_func_int **)((long)&local_5b8.pass.super__Function_base._M_functor + 8))
      goto LAB_001b89e2;
    }
    operator_delete(local_5b8._vptr_Pyramid,
                    (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
  }
LAB_001b89e2:
  local_650 = 0;
  pSVar28 = (this->m_flood_subshaders).
            super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_flood_subshaders).super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar28) {
    puVar13 = (undefined1 *)((long)&local_5b8.pass.super__Function_base._M_functor + 8);
    local_628 = &this->m_frag_source;
    do {
      uVar29 = local_650;
      vera::toString<unsigned_long>((string *)local_648,&local_650);
      puVar22 = (undefined8 *)std::__cxx11::string::replace((ulong)local_648,0,(char *)0x0,0x2f0e8b)
      ;
      pp_Var24 = (_func_int **)(puVar22 + 2);
      if ((_func_int **)*puVar22 == pp_Var24) {
        local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
        local_5b8.pass.super__Function_base._M_manager = (_Manager_type)puVar22[3];
        local_5b8._vptr_Pyramid = (_func_int **)puVar13;
      }
      else {
        local_5b8.pass.super__Function_base._M_functor._8_8_ = *pp_Var24;
        local_5b8._vptr_Pyramid = (_func_int **)*puVar22;
      }
      local_5b8.pass.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)puVar22[1];
      *puVar22 = pp_Var24;
      puVar22[1] = 0;
      *(undefined1 *)(puVar22 + 2) = 0;
      local_620[0] = (pointer)local_610;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_620,"");
      (*pSVar28[uVar29].super_HaveDefines._vptr_HaveDefines[10])
                (pSVar28 + uVar29,&local_5b8,(string *)local_620);
      DVar26 = extraout_EDX_17;
      if (local_620[0] != (pointer)local_610) {
        operator_delete(local_620[0],(ulong)(local_610._0_8_ + 1));
        DVar26 = extraout_EDX_18;
      }
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
        DVar26 = extraout_EDX_19;
      }
      if ((Sandbox *)local_648._0_8_ != (Sandbox *)(local_648 + 0x10)) {
        operator_delete((void *)local_648._0_8_,local_648._16_8_ + 1);
        DVar26 = extraout_EDX_20;
      }
      pSVar32 = (this->m_flood_subshaders).
                super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                super__Vector_impl_data._M_start + local_650;
      vera::getDefaultSrc_abi_cxx11_((string *)&local_5b8,(vera *)0x5,DVar26);
      vera::Shader::setSource(pSVar32,local_628,(string *)&local_5b8);
      if (local_5b8._vptr_Pyramid != (_func_int **)puVar13) {
        operator_delete(local_5b8._vptr_Pyramid,
                        (ulong)(local_5b8.pass.super__Function_base._M_functor._8_8_ + 1));
      }
      local_650 = local_650 + 1;
      pSVar28 = (this->m_flood_subshaders).
                super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_650 <
             (ulong)((long)(this->m_flood_subshaders).
                           super__Vector_base<vera::Shader,_std::allocator<vera::Shader>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pSVar28 >> 8));
  }
  if ((this->m_postprocessing != false) || (this->m_plot - PLOT_LUMA < 5)) {
    if (this->quilt_resolution < 0) {
      iVar17 = vera::getWindowWidth();
      _height = vera::getWindowHeight();
    }
    else {
      iVar17 = vera::getQuiltWidth();
      _height = vera::getQuiltHeight();
    }
    SceneRender::updateBuffers(&this->m_sceneRender,&this->uniforms,iVar17,_height);
  }
  return;
}

Assistant:

void Sandbox::_updateBuffers() {
    // Update Buffers
    if ( m_buffers_total != int(uniforms.buffers.size())) {
        if (verbose)
            std::cout << "Creating/removing " << uniforms.buffers.size() << " buffers to match " << m_buffers_total << std::endl;

        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            if (m_buffers_shaders[i].isLoaded())
                m_buffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.buffers.size(); i++)
            delete uniforms.buffers[i];

        uniforms.buffers.clear();
        m_buffers_shaders.clear();

        for (int i = 0; i < m_buffers_total; i++) {
            // New FBO
            uniforms.buffers.push_back( new vera::Fbo() );
            glm::vec3 size = getBufferSize(m_frag_source, "u_buffer" + vera::toString(i));
            uniforms.buffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.buffers[i]->scale = size.z;
            
            // New Shader
            m_buffers_shaders.push_back( vera::Shader() );
            m_buffers_shaders[i].addDefine("BUFFER_" + vera::toString(i));
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else
        for (size_t i = 0; i < m_buffers_shaders.size(); i++)
            m_buffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
            
    // Update Double Buffers
    if ( m_doubleBuffers_total != int(uniforms.doubleBuffers.size()) ) {

        if (verbose)
            std::cout << "Creating/removing " << uniforms.doubleBuffers.size() << " double buffers to match " << m_doubleBuffers_total << std::endl;

        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            if (m_doubleBuffers_shaders[i].isLoaded())
                m_doubleBuffers_shaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);

        for (size_t i = 0; i < uniforms.doubleBuffers.size(); i++)
            delete uniforms.doubleBuffers[i];

        uniforms.doubleBuffers.clear();
        m_doubleBuffers_shaders.clear();

        for (int i = 0; i < m_doubleBuffers_total; i++) {
            // New FBO
            uniforms.doubleBuffers.push_back( new vera::PingPong() );

            glm::vec3 size = getBufferSize(m_frag_source, "u_doubleBuffer" + vera::toString(i));
            uniforms.doubleBuffers[i]->allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.doubleBuffers[i]->buffer(0).scale = size.z;
            uniforms.doubleBuffers[i]->buffer(1).scale = size.z;
            
            // New Shader
            m_doubleBuffers_shaders.push_back( vera::Shader() );
            m_doubleBuffers_shaders[i].addDefine("DOUBLE_BUFFER_" + vera::toString(i));
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
    }
    else 
        for (size_t i = 0; i < m_doubleBuffers_shaders.size(); i++)
            m_doubleBuffers_shaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));

    // Update PYRAMID buffers
    if ( m_pyramid_total != int(uniforms.pyramids.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.pyramids.size() << " pyramids to create  " << m_pyramid_total << std::endl;

        for (size_t i = 0; i < m_pyramid_subshaders.size(); i++)
            if (m_pyramid_subshaders[i].isLoaded())
                m_pyramid_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.pyramids.clear();
        m_pyramid_fbos.clear();
        m_pyramid_subshaders.clear();

        for (int i = 0; i < m_pyramid_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_pyramid" + vera::toString(i));

            // Create Subshader
            m_pyramid_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.pyramids.push_back( vera::Pyramid() );
            uniforms.pyramids[i].allocate(size.x, size.y);
            uniforms.pyramids[i].scale = size.z;

            // Create pass function for this pyramid
            uniforms.pyramids[i].pass = [this](vera::Fbo *_target, const vera::Fbo *_tex0, const vera::Fbo *_tex1, int _depth) {
                _target->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_pyramid_shader.use();

                uniforms.feedTo( &m_pyramid_shader );

                m_pyramid_shader.setUniform("u_pyramidDepth", _depth);
                m_pyramid_shader.setUniform("u_pyramidTotalDepth", (int)uniforms.pyramids[0].getDepth());
                m_pyramid_shader.setUniform("u_pyramidUpscaling", _tex1 != NULL);

                m_pyramid_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_pyramid_shader.setUniformTexture("u_pyramidTex0", _tex0);
                if (_tex1 != NULL)
                    m_pyramid_shader.setUniformTexture("u_pyramidTex1", _tex1);
                m_pyramid_shader.setUniform("u_resolution", ((float)_target->getWidth()), ((float)_target->getHeight()));
                m_pyramid_shader.setUniform("u_pixel", 1.0f/((float)_target->getWidth()), 1.0f/((float)_target->getHeight()));

                vera::getBillboard()->render( &m_pyramid_shader );
                _target->unbind();
            };

            // Create input FBO
            m_pyramid_fbos.push_back( vera::Fbo() );
            m_pyramid_fbos[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            m_pyramid_fbos[i].scale = size.z;
        }
    }

    // Update PYRAMID algo
    if (m_pyramid_total > 0 ) {
        if ( checkPyramidAlgorithm( getSource(FRAGMENT) ) ) {
            m_pyramid_shader.addDefine("PYRAMID_ALGORITHM");
            m_pyramid_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_pyramid_shader.setSource(vera::getDefaultSrc(vera::FRAG_POISSONFILL), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    // Update PYRAMID subshaders
    for (size_t i = 0; i < m_pyramid_subshaders.size(); i++) {
        m_pyramid_subshaders[i].addDefine("PYRAMID_" + vera::toString(i));
        m_pyramid_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update FLOOD Buffers
    if ( m_flood_total != int(uniforms.floods.size()) ) {

        if (verbose)
            std::cout << "Removing " << uniforms.floods.size() << " flood to create " << m_flood_total << std::endl;

        for (size_t i = 0; i < m_flood_subshaders.size(); i++)
            if (m_flood_subshaders[i].isLoaded())
                m_flood_subshaders[i].detach(GL_FRAGMENT_SHADER | GL_VERTEX_SHADER);        

        uniforms.floods.clear();
        m_flood_subshaders.clear();

        for (int i = 0; i < m_flood_total; i++) {
            glm::vec3 size = getBufferSize(m_frag_source, "u_flood" + vera::toString(i));

            // Create Subshader
            m_flood_subshaders.push_back( vera::Shader() );
            
            // Create Pyramid structure
            uniforms.floods.push_back( vera::Flood() );
            uniforms.floods[i].allocate(size.x, size.y, vera::COLOR_FLOAT_TEXTURE);
            uniforms.floods[i].scale = size.z;

            // Create pass function for this flood
            uniforms.floods[i].pass = [this](vera::Fbo *_dst, const vera::Fbo *_src, int _index) {
                _dst->bind();
                glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
                glClear(GL_COLOR_BUFFER_BIT);
                m_flood_shader.use();

                // uniforms.feedTo( &m_flood_shader, false, false );

                m_flood_shader.setUniform("u_resolution", ((float)_dst->getWidth()), ((float)_dst->getHeight()));
                m_flood_shader.setUniform("u_floodIndex",_index);
                m_flood_shader.setUniform("u_floodTotal", (int)uniforms.floods[0].getTotalIterations());

                m_flood_shader.textureIndex = (uniforms.models.size() == 0) ? 1 : 0;
                m_flood_shader.setUniformTexture("u_floodSrc", _src);

                vera::getBillboard()->render( &m_flood_shader );
                _dst->unbind();
            };
        }
    }

    if (m_flood_total > 0 ) {
        if ( checkFloodAlgorithm( getSource(FRAGMENT) ) ) {
            m_flood_shader.addDefine("FLOOD_ALGORITHM");
            m_flood_shader.setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
        }
        else
            m_flood_shader.setSource(vera::getDefaultSrc(vera::FRAG_JUMPFLOOD), vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }
    
    for (size_t i = 0; i < m_flood_subshaders.size(); i++) {
        m_flood_subshaders[i].addDefine("FLOOD_" + vera::toString(i));
        m_flood_subshaders[i].setSource(m_frag_source, vera::getDefaultSrc(vera::VERT_BILLBOARD));
    }

    // Update Postprocessing
    if (m_postprocessing || m_plot == PLOT_RGB || m_plot == PLOT_RED || m_plot == PLOT_GREEN || m_plot == PLOT_BLUE || m_plot == PLOT_LUMA) {
        if (quilt_resolution >= 0)
            m_sceneRender.updateBuffers(uniforms, vera::getQuiltWidth(), vera::getQuiltHeight());
        else 
            m_sceneRender.updateBuffers(uniforms, vera::getWindowWidth(), vera::getWindowHeight());
    }

}